

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

char * spvGeneratorStr(uint32_t generator)

{
  undefined *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x580) {
      if (generator != 0x2c) {
        return "Unknown";
      }
      puVar1 = &DAT_004b3ea0;
LAB_001e1937:
      return *(char **)(puVar1 + 0x18);
    }
    if (*(uint32_t *)((long)&(anonymous_namespace)::vendor_tools + lVar2) == generator)
    goto LAB_001e1934;
    if (*(uint32_t *)((long)&DAT_004b3940 + lVar2) == generator) {
      if (lVar2 == 0x580) {
        return "Unknown";
      }
      puVar1 = (undefined *)((long)&DAT_004b3940 + lVar2);
      goto LAB_001e1937;
    }
    if (*(uint32_t *)((long)&DAT_004b3960 + lVar2) == generator) {
      lVar2 = lVar2 + 0x40;
LAB_001e1934:
      puVar1 = (undefined *)((long)&(anonymous_namespace)::vendor_tools + lVar2);
      goto LAB_001e1937;
    }
    if (*(uint32_t *)((long)&DAT_004b3980 + lVar2) == generator) {
      lVar2 = lVar2 + 0x60;
      goto LAB_001e1934;
    }
    lVar2 = lVar2 + 0x80;
  } while( true );
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}